

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderContext.hpp
# Opt level: O0

deUint32 glu::ApiType::pack(int major,int minor,Profile profile)

{
  deUint32 bits;
  Profile profile_local;
  int minor_local;
  int major_local;
  
  return profile << 8 | minor << 4 | major;
}

Assistant:

inline deUint32 ApiType::pack (int major, int minor, Profile profile)
{
	deUint32 bits = 0;

	DE_ASSERT((deUint32(major) & ~((1<<MAJOR_BITS)-1)) == 0);
	DE_ASSERT((deUint32(minor) & ~((1<<MINOR_BITS)-1)) == 0);
	DE_ASSERT((deUint32(profile) & ~((1<<PROFILE_BITS)-1)) == 0);

	bits |= deUint32(major) << MAJOR_SHIFT;
	bits |= deUint32(minor) << MINOR_SHIFT;
	bits |= deUint32(profile) << PROFILE_SHIFT;

	return bits;
}